

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void raviV_op_setlist(lua_State *L,CallInfo *ci,TValue *ra,int b,int c)

{
  uint nasize;
  LuaType LVar1;
  Table *t;
  RaviArray *t_00;
  int iVar2;
  lua_Integer value;
  uint ukey;
  ulong uVar3;
  char *pcVar4;
  TValue *pTVar5;
  uint uVar6;
  lua_Number value_00;
  lua_Integer i;
  lua_Integer local_40;
  CallInfo *local_38;
  
  if (b == 0) {
    b = (int)((ulong)((long)L->top - (long)ra) >> 4) - 1;
  }
  LVar1 = ra->tt_;
  nasize = c * 0x32 + -0x32 + b;
  uVar6 = c * 0x32 - 0x32;
  local_38 = ci;
  if ((LVar1 == 0x8025) || (LVar1 == 0x8015)) {
    t_00 = (RaviArray *)(ra->value_).gc;
    if ((t_00->tt != '\x15') && (t_00->tt != '%')) {
      pcVar4 = 
      "((((ra)->value_).gc)->tt == ((5) | ((1) << 4)) || (((ra)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_00131503;
    }
    pTVar5 = ra + (long)(int)uVar6 + 1;
    for (uVar3 = (ulong)(int)(uVar6 | 1); (long)uVar3 <= (long)(int)nasize; uVar3 = uVar3 + 1) {
      LVar1 = pTVar5->tt_;
      if ((t_00->flags & 8) == 0) {
        if (LVar1 == 0x13) {
          value = (pTVar5->value_).i;
        }
        else {
          local_40 = 0;
          iVar2 = luaV_tointegerns(pTVar5,&local_40,F2Ieq);
          value = local_40;
          if (iVar2 == 0) {
            pcVar4 = "value cannot be converted to integer";
LAB_001314ca:
            luaG_runerror(L,pcVar4);
          }
        }
        if ((uint)uVar3 < t_00->len) {
          *(lua_Integer *)(t_00->data + (uVar3 & 0xffffffff) * 8) = value;
        }
        else {
          raviH_set_int(L,t_00,uVar3 & 0xffffffff,value);
        }
      }
      else {
        if (LVar1 == 0x13) {
          value_00 = (lua_Number)(pTVar5->value_).i;
        }
        else {
          if (LVar1 != 3) {
            pcVar4 = "value cannot be converted to number";
            goto LAB_001314ca;
          }
          value_00 = (pTVar5->value_).n;
        }
        if ((uint)uVar3 < t_00->len) {
          *(lua_Number *)(t_00->data + (uVar3 & 0xffffffff) * 8) = value_00;
        }
        else {
          raviH_set_float(L,t_00,uVar3 & 0xffffffff,value_00);
        }
      }
      pTVar5 = pTVar5 + 1;
    }
  }
  else {
    if (LVar1 != 0x8005) {
      pcVar4 = 
      "(((((ra))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((ra))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
      ;
LAB_00131503:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xb08,"void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
    }
    t = (Table *)(ra->value_).gc;
    if (t->tt != '\x05') {
      __assert_fail("(((ra)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0xafe,"void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)");
    }
    if (t->sizearray < nasize) {
      luaH_resizearray(L,t,nasize);
    }
    pTVar5 = ra + (uint)b;
    for (; 0 < b; b = b - 1) {
      luaH_setint(L,t,(ulong)(uVar6 + b),pTVar5);
      if ((short)pTVar5->tt_ < 0) {
        if (9 < (t->tt & 0xe)) {
          __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0xb04,"void raviV_op_setlist(lua_State *, CallInfo *, TValue *, int, int)")
          ;
        }
        if (((t->marked & 0x20) != 0) && ((((pTVar5->value_).gc)->marked & 0x18) != 0)) {
          luaC_barrierback_(L,(GCObject *)t);
        }
      }
      pTVar5 = pTVar5 + -1;
    }
  }
  L->top = local_38->top;
  return;
}

Assistant:

void raviV_op_setlist(lua_State *L, CallInfo *ci, TValue *ra, int b, int c) {
  int n = b;
  unsigned int last;
  if (n == 0)
    n = cast_int(L->top - ra) - 1;
  last = ((c - 1) * LFIELDS_PER_FLUSH) + n;
  if (ttisLtable(ra)) {
    Table *h = hvalue(ra);
    if (last > h->sizearray)        /* needs more space? */
      luaH_resizearray(L, h, last); /* pre-allocate it at once */
    for (; n > 0; n--) {
      TValue *val = ra + n;
      luaH_setint(L, h, last--, val);
      luaC_barrierback(L, obj2gco(h), val);
    }
  }
  else {
    RaviArray *h = arrvalue(ra);
    int i = last - n + 1;
    for (; i <= (int)last; i++) {
      TValue *val = ra + i;
      unsigned int u = (unsigned int)(i);
      if ((h->flags & RAVI_ARRAY_ISFLOAT) == 0) {
        if (ttisinteger(val)) {
          raviH_set_int_inline(L, h, u, ivalue(val));
        }
        else {
          lua_Integer i = 0;
          if (tointegerns(val, &i)) {
            raviH_set_int_inline(L, h, u, i);
          }
          else
            luaG_runerror(L, "value cannot be converted to integer");
        }
      }
      else {
        if (ttisfloat(val)) {
          raviH_set_float_inline(L, h, u, fltvalue(val));
        }
        else if (ttisinteger(val)) {
          raviH_set_float_inline(L, h, u, (lua_Number)(ivalue(val)));
        }
        else {
          lua_Number d = 0.0;
          if (tonumberns(val, d)) {
            raviH_set_float_inline(L, h, u, d);
          }
          else
            luaG_runerror(L, "value cannot be converted to number");
        }
      }
    }
  }
  L->top = ci->top; /* correct top (in case of previous open call) */
}